

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O3

void * mi_calloc(size_t count,size_t size)

{
  long lVar1;
  undefined8 *__s;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  void *adst;
  void *pvVar4;
  long in_FS_OFFSET;
  
  if ((count != 1) &&
     (auVar2._8_8_ = 0, auVar2._0_8_ = count, auVar3._8_8_ = 0, auVar3._0_8_ = size,
     size = SUB168(auVar2 * auVar3,0), SUB168(auVar2 * auVar3,8) != 0)) {
    return (void *)0x0;
  }
  if (size < 0x401) {
    lVar1 = *(long *)((long)(*(mi_heap_t **)(in_FS_OFFSET + -0x58))->pages_free_direct +
                     (size + 7 & 0xfffffffffffffff8));
    __s = *(undefined8 **)(lVar1 + 0x10);
    if (__s != (undefined8 *)0x0) {
      *(undefined8 *)(lVar1 + 0x10) = *__s;
      *(short *)(lVar1 + 0x20) = *(short *)(lVar1 + 0x20) + 1;
      if ((*(byte *)(lVar1 + 0xf) & 1) != 0) {
        *__s = 0;
        return __s;
      }
      pvVar4 = memset(__s,0,*(size_t *)(lVar1 + 0x28));
      return pvVar4;
    }
  }
  pvVar4 = _mi_malloc_generic(*(mi_heap_t **)(in_FS_OFFSET + -0x58),size,true,0);
  return pvVar4;
}

Assistant:

void* mi_calloc(size_t count, size_t size) mi_attr_noexcept {
  return mi_heap_calloc(mi_prim_get_default_heap(),count,size);
}